

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O1

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  BYTE *istart;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  int iVar13;
  int iVar14;
  uint *puVar15;
  uint uVar16;
  int iVar17;
  short sVar18;
  uint uVar19;
  int iVar20;
  bool bVar21;
  
  sVar6 = 0xffffffffffffffb8;
  if (3 < hbSize) {
    uVar19 = *headerBuffer;
    uVar16 = uVar19 & 0xf;
    sVar6 = 0xffffffffffffffd4;
    if (uVar16 < 0xb) {
      *tableLogPtr = uVar16 + 5;
      iVar20 = 0x20 << (sbyte)uVar16;
      uVar4 = *maxSVPtr;
      iVar14 = iVar20 + 1;
      iVar17 = uVar16 + 6;
      uVar19 = uVar19 >> 4;
      puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar12 = (uint *)((long)headerBuffer + (hbSize - 4));
      uVar16 = 4;
      bVar21 = true;
      uVar11 = 0;
      puVar15 = (uint *)headerBuffer;
      do {
        uVar10 = uVar11;
        if (!bVar21) {
          sVar18 = (short)uVar19;
          uVar5 = uVar11;
          while (sVar18 == -1) {
            if (puVar15 < (uint *)((long)headerBuffer + (hbSize - 5))) {
              puVar3 = (uint *)((long)puVar15 + 2);
              puVar15 = (uint *)((long)puVar15 + 2);
              uVar19 = *puVar3 >> ((byte)uVar16 & 0x1f);
            }
            else {
              uVar19 = uVar19 >> 0x10;
              uVar16 = uVar16 + 0x10;
            }
            uVar5 = uVar5 + 0x18;
            sVar18 = (short)uVar19;
          }
          for (; (uVar19 & 3) == 3; uVar19 = uVar19 >> 2) {
            uVar5 = uVar5 + 3;
            uVar16 = uVar16 + 2;
          }
          uVar5 = uVar5 + (uVar19 & 3);
          uVar16 = uVar16 + 2;
          if (uVar5 <= uVar4) {
            if (uVar11 < uVar5) {
              memset(normalizedCounter + uVar11,0,(ulong)(~uVar11 + uVar5) * 2 + 2);
              lVar7 = 0;
              do {
                lVar7 = lVar7 + -1;
              } while ((ulong)uVar11 - (ulong)uVar5 != lVar7);
              uVar11 = uVar11 - (int)lVar7;
            }
            iVar9 = (int)uVar16 >> 3;
            if ((puVar2 < puVar15) && (puVar12 < (uint *)((long)iVar9 + (long)puVar15))) {
              uVar19 = uVar19 >> 2;
            }
            else {
              puVar3 = (uint *)((long)puVar15 + (long)iVar9);
              puVar15 = (uint *)((long)puVar15 + (long)iVar9);
              uVar16 = uVar16 & 7;
              uVar19 = *puVar3 >> (sbyte)uVar16;
            }
          }
          uVar10 = uVar11;
          if (uVar4 < uVar5) {
            return 0xffffffffffffffd0;
          }
        }
        uVar11 = iVar20 * 2 - 1;
        uVar8 = uVar11 - iVar14;
        uVar5 = iVar20 - 1U & uVar19;
        if (uVar5 < uVar8) {
          iVar9 = iVar17 + -1;
        }
        else {
          uVar19 = uVar19 & uVar11;
          if ((int)uVar19 < iVar20) {
            uVar8 = 0;
          }
          uVar5 = uVar19 - uVar8;
          iVar9 = iVar17;
        }
        iVar1 = uVar5 - 1;
        iVar13 = 1 - uVar5;
        if (0 < (int)uVar5) {
          iVar13 = iVar1;
        }
        iVar14 = iVar14 - iVar13;
        normalizedCounter[uVar10] = (short)iVar1;
        bVar21 = iVar1 != 0;
        for (; iVar14 < iVar20; iVar20 = iVar20 >> 1) {
          iVar17 = iVar17 + -1;
        }
        uVar16 = iVar9 + uVar16;
        if ((puVar2 < puVar15) && (puVar12 < (uint *)((long)((int)uVar16 >> 3) + (long)puVar15))) {
          uVar16 = uVar16 + ((int)puVar15 - (int)puVar12) * 8;
          puVar15 = puVar12;
        }
        else {
          puVar15 = (uint *)((long)puVar15 + (long)((int)uVar16 >> 3));
          uVar16 = uVar16 & 7;
        }
        uVar11 = uVar10 + 1;
        uVar19 = *puVar15 >> ((byte)uVar16 & 0x1f);
      } while ((1 < iVar14) && (uVar11 <= uVar4));
      sVar6 = 0xffffffffffffffec;
      if ((iVar14 == 1) && ((int)uVar16 < 0x21)) {
        for (; uVar11 <= uVar4; uVar11 = uVar11 + 1) {
          normalizedCounter[uVar11] = 0;
        }
        *maxSVPtr = uVar10;
        sVar6 = (long)puVar15 + ((long)((int)(uVar16 + 7) >> 3) - (long)headerBuffer);
      }
    }
  }
  return sVar6;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    if (hbSize < 4) return ERROR(srcSize_wrong);
    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    /* zeroise the rest */
    {   unsigned symbNb = charnum;
        for (symbNb=charnum; symbNb <= *maxSVPtr; symbNb++)
            normalizedCounter[symbNb] = 0;
    }
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}